

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O3

size_t uc_context_size(uc_engine *uc)

{
  uc_err uVar1;
  size_t sVar2;
  
  if ((uc->init_done == false) && (uVar1 = uc_init_engine(uc), uVar1 != UC_ERR_OK)) {
    return (ulong)uVar1;
  }
  if (uc->context_size == (uc_context_size_t)0x0) {
    sVar2 = (size_t)uc->cpu_context_size;
  }
  else {
    sVar2 = (*uc->context_size)(uc);
  }
  return sVar2 + 0x18;
}

Assistant:

UNICORN_EXPORT
size_t uc_context_size(uc_engine *uc)
{
    UC_INIT(uc);

    if (!uc->context_size) {
        // return the total size of struct uc_context
        return sizeof(uc_context) + uc->cpu_context_size;
    } else {
        return sizeof(uc_context) + uc->context_size(uc);
    }
}